

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  Own<capnp::PipelineHook> local_90;
  Pipeline local_80;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  local_58;
  Pipeline local_38;
  
  kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>::
  then<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>
              *)&local_38,(anon_class_1_0_00000001_for_func *)promise,
             (PropagateException *)&local_80);
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  ::split((SplitTuplePromise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
           *)&local_58,
          (Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
           *)&local_38);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_38);
  newLocalPromisePipeline
            ((capnp *)&local_90,
             &local_58.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value);
  local_38.hook.ptr = local_90.ptr;
  local_90.ptr = (PipelineHook *)0x0;
  local_80.hook.disposer = local_90.disposer;
  local_80.ops.disposer = (ArrayDisposer *)0x0;
  local_80.hook.ptr = (PipelineHook *)0x0;
  local_38.hook.disposer = local_90.disposer;
  local_38.ops.ptr = (PipelineOp *)0x0;
  local_38.ops.size_ = 0;
  local_38.ops.disposer = (ArrayDisposer *)0x0;
  local_80.ops.ptr = (PipelineOp *)0x0;
  local_80.ops.size_ = 0;
  RemotePromise(__return_storage_ptr__,
                (Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                 *)&local_58,(Pipeline *)&local_38);
  AnyPointer::Pipeline::~Pipeline(&local_38);
  AnyPointer::Pipeline::~Pipeline(&local_80);
  kj::Own<capnp::PipelineHook>::dispose(&local_90);
  kj::_::
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  ::~TupleImpl(&local_58);
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}